

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcElectricalCircuit::~IfcElectricalCircuit(IfcElectricalCircuit *this)

{
  ~IfcElectricalCircuit
            ((IfcElectricalCircuit *)
             &this[-1].super_IfcSystem.super_IfcGroup.super_IfcObject.field_0x48);
  return;
}

Assistant:

IfcElectricalCircuit() : Object("IfcElectricalCircuit") {}